

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cc
# Opt level: O3

bool __thiscall
flow::lang::CallableSym::tryMatch(CallableSym *this,ParamList *params,string *errorMessage)

{
  string *name;
  long *plVar1;
  NativeCallback *this_00;
  pointer pbVar2;
  pointer pvVar3;
  undefined8 uVar4;
  bool bVar5;
  LiteralType LVar6;
  LiteralType LVar7;
  Signature *pSVar8;
  Signature *pSVar9;
  pointer puVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  iterator __begin4;
  Signature *pSVar14;
  long lVar15;
  ulong *puVar16;
  iterator __end4;
  pointer puVar17;
  long lVar18;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  basic_string_view<char> format_str_02;
  basic_string_view<char> format_str_03;
  basic_string_view<char> format_str_04;
  basic_string_view<char> format_str_05;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_01;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_02;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_03;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_04;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_05;
  string t;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  superfluous;
  Signature sig;
  Signature *local_2f8;
  code *pcStack_2f0;
  undefined1 local_2e8 [32];
  LiteralType *local_2c8;
  undefined1 local_2b8 [24];
  code *pcStack_2a0;
  LiteralType local_298;
  vector<flow::LiteralType,_std::allocator<flow::LiteralType>_> local_290;
  Signature *local_278;
  ulong local_270;
  long *local_268 [2];
  long local_258 [2];
  undefined **local_248;
  undefined1 *local_240;
  long local_238;
  ulong local_230;
  undefined1 local_228 [504];
  
  this_00 = this->nativeCallback_;
  if (((params->values_).
       super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       (params->values_).
       super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) ||
     ((bVar5 = true, this_00 != (NativeCallback *)0x0 &&
      (pSVar8 = NativeCallback::signature(this_00),
      (pSVar8->args_).super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (pSVar8->args_).super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>.
      _M_impl.super__Vector_impl_data._M_finish)))) {
    if (params->isNamed_ == true) {
      if ((this_00->names_).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (this_00->names_).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        if (this->nativeCallback_ == (NativeCallback *)0x0) {
          pSVar8 = &this->sig_;
        }
        else {
          pSVar8 = NativeCallback::signature(this->nativeCallback_);
        }
        uVar13 = (ulong)((long)(pSVar8->args_).
                               super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pSVar8->args_).
                              super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 2;
        if ((int)uVar13 == 0) {
LAB_00130867:
          local_2e8._16_8_ = (ulong *)0x0;
          local_2e8._24_8_ = (ulong *)0x0;
          local_2c8 = (LiteralType *)0x0;
          ParamList::reorder(params,this_00,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)(local_2e8 + 0x10));
          uVar4 = local_2e8._24_8_;
          bVar5 = local_2e8._16_8_ == local_2e8._24_8_;
          if (!bVar5) {
            local_2f8 = (Signature *)local_2e8;
            pcStack_2f0 = (code *)0x0;
            local_2e8._0_8_ = local_2e8._0_8_ & 0xffffffffffffff00;
            puVar16 = (ulong *)local_2e8._16_8_;
            do {
              if (pcStack_2f0 != (code *)0x0) {
                std::__cxx11::string::append((char *)&local_2f8);
              }
              std::__cxx11::string::append((char *)&local_2f8);
              std::__cxx11::string::_M_append((char *)&local_2f8,*puVar16);
              std::__cxx11::string::append((char *)&local_2f8);
              puVar16 = puVar16 + 4;
            } while (puVar16 != (ulong *)uVar4);
            local_2b8._0_8_ = (this->super_Symbol).name_._M_dataplus._M_p;
            local_2b8._8_8_ = (this->super_Symbol).name_._M_string_length;
            local_2b8._16_8_ = local_2f8;
            pcStack_2a0 = pcStack_2f0;
            local_238 = 0;
            local_248 = &PTR_grow_0019b370;
            local_230 = 500;
            format_str_00.size_ = 0x30;
            format_str_00.data_ = "Superfluous arguments passed to callee \"{}\": {}.";
            args_00.field_1.values_ =
                 (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                  *)local_2b8;
            args_00.types_ = 0xbb;
            local_240 = local_228;
            fmt::v5::
            vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                      ((range)&local_248,format_str_00,args_00);
            local_268[0] = local_258;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_268,local_240,local_240 + local_238);
            local_248 = &PTR_grow_0019b370;
            if (local_240 != local_228) {
              operator_delete(local_240,local_230);
            }
            std::__cxx11::string::operator=((string *)errorMessage,(string *)local_268);
            if (local_268[0] != local_258) {
              operator_delete(local_268[0],local_258[0] + 1);
            }
            if (local_2f8 != (Signature *)local_2e8) {
              operator_delete(local_2f8,(ulong)(local_2e8._0_8_ + 1));
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_2e8 + 0x10));
          return bVar5;
        }
        local_278 = &this->sig_;
        local_270 = uVar13 & 0xffffffff;
        lVar18 = 0;
        lVar15 = 0;
        uVar13 = 0;
LAB_001307a3:
        pbVar2 = (this_00->names_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(this_00->names_).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) <= uVar13)
        {
LAB_0013102f:
          __assert_fail("i < names_.size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/NativeCallback.h"
                        ,0x15a,
                        "const std::string &flow::NativeCallback::getParamNameAt(size_t) const");
        }
        name = (string *)((long)&(pbVar2->_M_dataplus)._M_p + lVar15);
        bVar5 = ParamList::contains(params,name);
        if (bVar5) goto LAB_00130849;
        pvVar3 = (this_00->defaults_).
                 super__Vector_base<std::variant<std::monostate,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>,_std::allocator<std::variant<std::monostate,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar11 = ((long)(this_00->defaults_).
                        super__Vector_base<std::variant<std::monostate,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>,_std::allocator<std::variant<std::monostate,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
                 0x2e8ba2e8ba2e8ba3;
        if (uVar11 < uVar13 || uVar11 - uVar13 == 0) {
LAB_0013104e:
          __assert_fail("i < defaults_.size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/NativeCallback.h"
                        ,0x15f,
                        "const NativeCallback::DefaultValue &flow::NativeCallback::getDefaultParamAt(size_t) const"
                       );
        }
        if (*(char *)((long)&(pvVar3->
                             super__Variant_base<std::monostate,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>
                             ).
                             super__Move_assign_alias<std::monostate,_bool,_std::__cxx11::basic_string<char>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>
                             .
                             super__Copy_assign_alias<std::monostate,_bool,_std::__cxx11::basic_string<char>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>
                     + lVar18 + 0x50) != '\0') {
          pSVar8 = local_278;
          if (this->nativeCallback_ != (NativeCallback *)0x0) {
            pSVar8 = NativeCallback::signature(this->nativeCallback_);
          }
          completeDefaultValue
                    (params,(pSVar8->args_).
                            super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar13],
                     (DefaultValue *)
                     ((long)&(pvVar3->
                             super__Variant_base<std::monostate,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>
                             ).
                             super__Move_assign_alias<std::monostate,_bool,_std::__cxx11::basic_string<char>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>
                             .
                             super__Copy_assign_alias<std::monostate,_bool,_std::__cxx11::basic_string<char>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>
                     + lVar18),name);
          goto LAB_00130849;
        }
        local_2b8._0_8_ = (this->super_Symbol).name_._M_dataplus._M_p;
        local_2b8._8_8_ = (this->super_Symbol).name_._M_string_length;
        plVar1 = (long *)((long)&(pbVar2->_M_dataplus)._M_p + lVar15);
        local_2b8._16_8_ = *plVar1;
        pcStack_2a0 = (code *)plVar1[1];
        local_238 = 0;
        local_248 = &PTR_grow_0019b370;
        local_230 = 500;
        format_str_03.size_ = 0x3a;
        format_str_03.data_ = "Callee \"{}\" invoked without required named parameter \"{}\".";
        args_03.field_1.values_ =
             (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              *)local_2b8;
        args_03.types_ = 0xbb;
        local_240 = local_228;
        fmt::v5::
        vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                  ((range)&local_248,format_str_03,args_03);
        local_2f8 = (Signature *)local_2e8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2f8,local_240,local_240 + local_238);
        local_248 = &PTR_grow_0019b370;
        if (local_240 != local_228) {
          operator_delete(local_240,local_230);
        }
LAB_00130ffc:
        std::__cxx11::string::operator=((string *)errorMessage,(string *)&local_2f8);
        pSVar8 = local_2f8;
        if (local_2f8 != (Signature *)local_2e8) goto LAB_00131011;
        goto LAB_00131019;
      }
      local_2f8 = (Signature *)(this->super_Symbol).name_._M_dataplus._M_p;
      pcStack_2f0 = (code *)(this->super_Symbol).name_._M_string_length;
      local_240 = local_228;
      local_238 = 0;
      local_248 = &PTR_grow_0019b370;
      local_230 = 500;
      format_str.size_ = 0x4c;
      format_str.data_ =
           "Callee \"{}\" invoked with named parameters, but no names provided by runtime.";
      args.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)&local_2f8;
      args.types_ = 0xb;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_248,format_str,args);
      local_2b8._0_8_ = local_2b8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2b8,local_240,local_240 + local_238);
    }
    else {
      puVar10 = (params->values_).
                super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      puVar17 = (params->values_).
                super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (this->nativeCallback_ == (NativeCallback *)0x0) {
        pSVar8 = &this->sig_;
      }
      else {
        pSVar8 = NativeCallback::signature(this->nativeCallback_);
      }
      if ((ulong)((long)puVar10 - (long)puVar17 >> 3) <=
          (ulong)((long)(pSVar8->args_).
                        super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(pSVar8->args_).
                        super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 2)) {
        puVar10 = (params->values_).
                  super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        lVar15 = (long)puVar10 -
                 (long)(params->values_).
                       super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        puVar17 = puVar10;
        if (lVar15 != 0) {
          pSVar8 = &this->sig_;
          pSVar14 = (Signature *)0x1;
          do {
            pSVar9 = pSVar8;
            if (this->nativeCallback_ != (NativeCallback *)0x0) {
              pSVar9 = NativeCallback::signature(this->nativeCallback_);
            }
            LVar7 = (pSVar9->args_).
                    super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>.
                    _M_impl.super__Vector_impl_data._M_start
                    [(long)((long)&pSVar14[-1].args_.
                                   super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>
                                   ._M_impl + 0x17)];
            LVar6 = (**(code **)(*(long *)(params->values_).
                                          super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start
                                          [(long)((long)&pSVar14[-1].args_.
                                                                                                                  
                                                  super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>
                                                  ._M_impl + 0x17)]._M_t.
                                          super___uniq_ptr_impl<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>
                                          ._M_t + 0x18))();
            if (LVar6 != LVar7) {
              if (this->nativeCallback_ != (NativeCallback *)0x0) {
                pSVar8 = NativeCallback::signature(this->nativeCallback_);
              }
              pcStack_2a0 = fmt::v5::internal::
                            value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                            ::format_custom_arg<flow::Signature>;
              local_240 = local_228;
              local_238 = 0;
              local_248 = &PTR_grow_0019b370;
              local_230 = 500;
              format_str_02.size_ = 0x34;
              format_str_02.data_ = "Type mismatch in positional parameter {}, callee {}.";
              args_02.field_1.values_ =
                   (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                    *)local_2b8;
              args_02.types_ = 0xd5;
              local_2b8._0_8_ = pSVar14;
              local_2b8._16_8_ = pSVar8;
              fmt::v5::
              vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                        ((range)&local_248,format_str_02,args_02);
              local_2f8 = (Signature *)local_2e8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_2f8,local_240,local_240 + local_238);
              goto LAB_00130fd2;
            }
            bVar5 = pSVar14 != (Signature *)(lVar15 >> 3);
            pSVar14 = (Signature *)((long)&(pSVar14->name_)._M_dataplus._M_p + 1);
          } while (bVar5);
          puVar10 = (params->values_).
                    super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar17 = (params->values_).
                    super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        uVar13 = (long)puVar17 - (long)puVar10 >> 3;
        if (this->nativeCallback_ == (NativeCallback *)0x0) {
          pSVar8 = &this->sig_;
        }
        else {
          pSVar8 = NativeCallback::signature(this->nativeCallback_);
        }
        uVar11 = (long)(pSVar8->args_).
                       super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(pSVar8->args_).
                       super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 2;
        if (uVar13 == uVar11) {
LAB_00130ced:
          Signature::Signature((Signature *)local_2b8);
          std::__cxx11::string::_M_assign((string *)local_2b8);
          if (this->nativeCallback_ == (NativeCallback *)0x0) {
            pSVar8 = &this->sig_;
          }
          else {
            pSVar8 = NativeCallback::signature(this->nativeCallback_);
          }
          local_298 = pSVar8->returnType_;
          local_2e8._16_8_ = (void *)0x0;
          local_2e8._24_8_ = (LiteralType *)0x0;
          local_2c8 = (LiteralType *)0x0;
          puVar10 = (params->values_).
                    super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar17 = (params->values_).
                    super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if (puVar10 != puVar17) {
            do {
              LVar7 = (**(code **)((long)(((puVar10->_M_t).
                                           super___uniq_ptr_impl<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>
                                           .super__Head_base<0UL,_flow::lang::Expr_*,_false>.
                                          _M_head_impl)->super_ASTNode)._vptr_ASTNode + 0x18))();
              local_248 = (undefined **)CONCAT44(local_248._4_4_,LVar7);
              if ((LiteralType *)local_2e8._24_8_ == local_2c8) {
                std::vector<flow::LiteralType,_std::allocator<flow::LiteralType>_>::
                _M_realloc_insert<flow::LiteralType>
                          ((vector<flow::LiteralType,_std::allocator<flow::LiteralType>_> *)
                           (local_2e8 + 0x10),(iterator)local_2e8._24_8_,(LiteralType *)&local_248);
              }
              else {
                *(LiteralType *)local_2e8._24_8_ = LVar7;
                local_2e8._24_8_ = local_2e8._24_8_ + 4;
              }
              puVar10 = puVar10 + 1;
            } while (puVar10 != puVar17);
          }
          std::vector<flow::LiteralType,_std::allocator<flow::LiteralType>_>::operator=
                    (&local_290,
                     (vector<flow::LiteralType,_std::allocator<flow::LiteralType>_> *)
                     (local_2e8 + 0x10));
          if (this->nativeCallback_ == (NativeCallback *)0x0) {
            pSVar8 = &this->sig_;
          }
          else {
            pSVar8 = NativeCallback::signature(this->nativeCallback_);
          }
          bVar5 = Signature::operator!=((Signature *)local_2b8,pSVar8);
          if (bVar5) {
            if (this->nativeCallback_ == (NativeCallback *)0x0) {
              local_2e8._0_8_ = &this->sig_;
            }
            else {
              local_2e8._0_8_ = NativeCallback::signature(this->nativeCallback_);
            }
            pcStack_2f0 = fmt::v5::internal::
                          value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                          ::format_custom_arg<flow::Signature>;
            local_2e8._8_8_ =
                 fmt::v5::internal::
                 value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                 ::format_custom_arg<flow::Signature>;
            local_238 = 0;
            local_248 = &PTR_grow_0019b370;
            local_230 = 500;
            format_str_04.size_ = 0x45;
            format_str_04.data_ =
                 "Callee parameter type signature mismatch: {} passed, but {} expected.";
            args_04.field_1.values_ =
                 (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                  *)&local_2f8;
            args_04.types_ = 0xdd;
            local_2f8 = (Signature *)local_2b8;
            local_240 = local_228;
            fmt::v5::
            vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                      ((range)&local_248,format_str_04,args_04);
            local_268[0] = local_258;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_268,local_240,local_240 + local_238);
            local_248 = &PTR_grow_0019b370;
            if (local_240 != local_228) {
              operator_delete(local_240,local_230);
            }
            std::__cxx11::string::operator=((string *)errorMessage,(string *)local_268);
            if (local_268[0] != local_258) {
              operator_delete(local_268[0],local_258[0] + 1);
            }
          }
          if ((void *)local_2e8._16_8_ != (void *)0x0) {
            operator_delete((void *)local_2e8._16_8_,(long)local_2c8 - local_2e8._16_8_);
          }
          if (local_290.super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_290.
                            super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_290.
                                  super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_290.
                                  super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
            operator_delete((void *)local_2b8._0_8_,(ulong)(local_2b8._16_8_ + 1));
          }
          return !bVar5;
        }
        lVar18 = uVar13 * 0x58;
        lVar15 = uVar13 << 5;
LAB_00130c5b:
        pvVar3 = (this_00->defaults_).
                 super__Vector_base<std::variant<std::monostate,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>,_std::allocator<std::variant<std::monostate,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar12 = ((long)(this_00->defaults_).
                        super__Vector_base<std::variant<std::monostate,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>,_std::allocator<std::variant<std::monostate,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
                 0x2e8ba2e8ba2e8ba3;
        if (uVar13 <= uVar12 && uVar12 - uVar13 != 0) {
          if (*(char *)((long)&(pvVar3->
                               super__Variant_base<std::monostate,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>
                               ).
                               super__Move_assign_alias<std::monostate,_bool,_std::__cxx11::basic_string<char>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>
                               .
                               super__Copy_assign_alias<std::monostate,_bool,_std::__cxx11::basic_string<char>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>
                       + lVar18 + 0x50) == '\0') {
            if (this->nativeCallback_ == (NativeCallback *)0x0) {
              local_2b8._16_8_ = &this->sig_;
            }
            else {
              local_2b8._16_8_ = NativeCallback::signature(this->nativeCallback_);
            }
            pcStack_2a0 = fmt::v5::internal::
                          value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                          ::format_custom_arg<flow::Signature>;
            local_240 = local_228;
            local_238 = 0;
            local_248 = &PTR_grow_0019b370;
            local_230 = 500;
            format_str_05.size_ = 0x41;
            format_str_05.data_ =
                 "No default value provided for positional parameter {}, callee {}.";
            args_05.field_1.values_ =
                 (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                  *)local_2b8;
            args_05.types_ = 0xd5;
            local_2b8._0_8_ = (Signature *)(uVar13 + 1);
            fmt::v5::
            vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                      ((range)&local_248,format_str_05,args_05);
            local_2f8 = (Signature *)local_2e8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_2f8,local_240,local_240 + local_238);
LAB_00130fd2:
            local_248 = &PTR_grow_0019b370;
            if (local_240 != local_228) {
              operator_delete(local_240,local_230);
            }
            goto LAB_00130ffc;
          }
          pbVar2 = (this_00->names_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (uVar13 < (ulong)((long)(this_00->names_).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5)
             ) goto code_r0x00130cb1;
          goto LAB_0013102f;
        }
        goto LAB_0013104e;
      }
      if (this->nativeCallback_ == (NativeCallback *)0x0) {
        local_2f8 = &this->sig_;
      }
      else {
        local_2f8 = NativeCallback::signature(this->nativeCallback_);
      }
      pcStack_2f0 = fmt::v5::internal::
                    value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                    ::format_custom_arg<flow::Signature>;
      local_240 = local_228;
      local_238 = 0;
      local_248 = &PTR_grow_0019b370;
      local_230 = 500;
      format_str_01.size_ = 0x24;
      format_str_01.data_ = "Superfluous parameters to callee {}.";
      args_01.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)&local_2f8;
      args_01.types_ = 0xd;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_248,format_str_01,args_01);
      local_2b8._0_8_ = local_2b8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2b8,local_240,local_240 + local_238);
    }
    local_248 = &PTR_grow_0019b370;
    if (local_240 != local_228) {
      operator_delete(local_240,local_230);
    }
    std::__cxx11::string::operator=((string *)errorMessage,(string *)local_2b8);
    local_2e8._0_8_ = local_2b8._16_8_;
    pSVar8 = (Signature *)local_2b8._0_8_;
    if ((Signature *)local_2b8._0_8_ != (Signature *)(local_2b8 + 0x10)) {
LAB_00131011:
      operator_delete(pSVar8,(ulong)((long)&(((Signature *)local_2e8._0_8_)->name_)._M_dataplus._M_p
                                    + 1));
    }
LAB_00131019:
    bVar5 = false;
  }
  return bVar5;
code_r0x00130cb1:
  pSVar8 = NativeCallback::signature(this_00);
  completeDefaultValue
            (params,(pSVar8->args_).
                    super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar13],
             (DefaultValue *)
             ((long)&(pvVar3->
                     super__Variant_base<std::monostate,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>
                     ).
                     super__Move_assign_alias<std::monostate,_bool,_std::__cxx11::basic_string<char>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>
                     .
                     super__Copy_assign_alias<std::monostate,_bool,_std::__cxx11::basic_string<char>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>
             + lVar18),(string *)((long)&(pbVar2->_M_dataplus)._M_p + lVar15));
  uVar13 = uVar13 + 1;
  lVar18 = lVar18 + 0x58;
  lVar15 = lVar15 + 0x20;
  if (uVar11 == uVar13) goto LAB_00130ced;
  goto LAB_00130c5b;
LAB_00130849:
  uVar13 = uVar13 + 1;
  lVar15 = lVar15 + 0x20;
  lVar18 = lVar18 + 0x58;
  if (local_270 == uVar13) goto LAB_00130867;
  goto LAB_001307a3;
}

Assistant:

bool CallableSym::tryMatch(ParamList& params, std::string* errorMessage) const {
  // printf("CallableSym(%s).tryMatch()\n", name().c_str());

  const NativeCallback* native = nativeCallback();

  if (params.empty() && (!native || native->signature().args().empty()))
    return true;

  if (params.isNamed()) {
    if (!native->parametersNamed()) {
      *errorMessage = fmt::format(
          "Callee \"{}\" invoked with named parameters, but no names provided "
          "by runtime.",
          name());
      return false;
    }

    int argc = signature().args().size();
    for (int i = 0; i != argc; ++i) {
      const auto& paramName = native->getParamNameAt(i);
      if (!params.contains(paramName)) {
        const NativeCallback::DefaultValue& defaultValue =
            native->getDefaultParamAt(i);
        if (std::holds_alternative<std::monostate>(defaultValue)) {
          *errorMessage = fmt::format(
              "Callee \"{}\" invoked without required named parameter \"{}\".",
              name(), paramName);
          return false;
        }
        LiteralType type = signature().args()[i];
        completeDefaultValue(params, type, defaultValue, paramName);
      }
    }

    // reorder params (and detect superfluous params)
    std::vector<std::string> superfluous;
    params.reorder(native, &superfluous);

    if (!superfluous.empty()) {
      std::string t;
      for (const auto& s : superfluous) {
        if (!t.empty()) t += ", ";
        t += "\"";
        t += s;
        t += "\"";
      }
      *errorMessage = fmt::format(
          "Superfluous arguments passed to callee \"{}\": {}.", name(), t);
      return false;
    }

    return true;
  } else  // verify params positional
  {
    if (params.size() > signature().args().size()) {
      *errorMessage = fmt::format("Superfluous parameters to callee {}.", signature());
      return false;
    }

    for (size_t i = 0, e = params.size(); i != e; ++i) {
      LiteralType expectedType = signature().args()[i];
      LiteralType givenType = params.values()[i]->getType();
      if (givenType != expectedType) {
        *errorMessage = fmt::format(
            "Type mismatch in positional parameter {}, callee {}.",
            i + 1, signature());
        return false;
      }
    }

    for (size_t i = params.size(), e = signature().args().size(); i != e; ++i) {
      const NativeCallback::DefaultValue& defaultValue = native->getDefaultParamAt(i);
      if (std::holds_alternative<std::monostate>(defaultValue)) {
        *errorMessage = fmt::format(
            "No default value provided for positional parameter {}, callee {}.",
            i + 1, signature());
        return false;
      }

      const std::string& name = native->getParamNameAt(i);
      LiteralType type = native->signature().args()[i];
      completeDefaultValue(params, type, defaultValue, name);
    }

    Signature sig;
    sig.setName(this->name());
    sig.setReturnType(signature().returnType());  // XXX cheetah
    std::vector<LiteralType> argTypes;
    for (const auto& arg : params.values()) {
      argTypes.push_back(arg->getType());
    }
    sig.setArgs(argTypes);

    if (sig != signature()) {
      *errorMessage = fmt::format(
          "Callee parameter type signature mismatch: {} passed, but {} expected.",
          sig, signature());
      return false;
    }

    return true;
  }
}